

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgecko.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  double dVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int columns;
  int columns_00;
  uint uVar9;
  int columns_01;
  Index i;
  uint uVar10;
  char *pcVar11;
  uint nodes;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  allocator local_34e;
  allocator local_34d;
  int local_34c;
  int local_348;
  float local_344;
  float local_340;
  allocator local_33a;
  allocator local_339;
  ulong local_338;
  int local_32c;
  uint maxsize;
  uint maxdims;
  ulong local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string error_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  string error_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  Graph graph;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  maxdims = 5;
  maxsize = 6;
  if ((argc == 1) ||
     (((argc == 2 || ((argc == 3 && (iVar4 = sscanf(argv[2],"%u",&maxsize), iVar4 == 1)))) &&
      (iVar4 = sscanf(argv[1],"%u",&maxdims), iVar4 == 1)))) {
    std::__cxx11::string::string((string *)&local_90,"library version test",(allocator *)&graph);
    poVar7 = std::operator<<((ostream *)&std::cerr,Gecko::version_string);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cerr,"library version ");
    lVar12 = *(long *)poVar7;
    *(uint *)(poVar7 + *(long *)(lVar12 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(lVar12 + -0x18) + 0x18) | 0x200;
    lVar12 = *(long *)(lVar12 + -0x18);
    *(uint *)(poVar7 + lVar12 + 0x18) = *(uint *)(poVar7 + lVar12 + 0x18) & 0xffffffb5 | 8;
    iVar4 = (int)Gecko::version;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar7);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    if (iVar4 == 0x100) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = '\0';
      iVar4 = extraout_EDX;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_130,"header and binary version mismatch",&local_33a);
      iVar4 = extraout_EDX_00;
    }
    iVar4 = report(&local_90,&local_130,iVar4);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    Gecko::Graph::Graph(&graph,0x10000);
    uVar13 = 1;
LAB_0010252b:
    uVar10 = uVar13;
    if (uVar10 != 0x10001) {
      uVar14 = (uint)&graph;
      if (1 < uVar10) goto code_r0x0010253d;
      goto LAB_00102567;
    }
    if (((long)graph.node.super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)graph.node.super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
               super__Vector_impl_data._M_start & 0xffffffff0U) == 0x100010) {
      if ((((ulong)((long)graph.adj.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)graph.adj.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff & 0x1fffffffe
          ) == 0x1fffe) {
        plVar8 = (long *)operator_new(8);
        *plVar8 = (long)&PTR__Functional_00105cf0;
        Gecko::Graph::order((Functional *)&graph,(uint)plVar8,1,4,0,(Progress *)0x1);
        (**(code **)(*plVar8 + 8))(plVar8);
        lVar12 = 1;
        do {
          if (lVar12 == 0x10000) {
            error._M_dataplus._M_p = (pointer)&error.field_2;
            error._M_string_length = 0;
            error.field_2._M_local_buf[0] = '\0';
            goto LAB_001027ec;
          }
          uVar13 = graph.perm.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar12 + -1];
          uVar10 = graph.perm.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar12];
          iVar5 = Gecko::Graph::arc_index((uint)&graph,uVar13);
          lVar12 = lVar12 + 1;
        } while (iVar5 != 0);
        std::__cxx11::string::string((string *)&local_280,"{",(allocator *)&error_1);
        stringize<unsigned_int>(&error_2,uVar13);
        std::operator+(&local_260,&local_280,&error_2);
        std::__cxx11::string::string((string *)&local_150,", ",&local_34d);
        std::operator+(&local_318,&local_260,&local_150);
        stringize<unsigned_int>(&local_170,uVar10);
        std::operator+(&local_2d8,&local_318,&local_170);
        std::__cxx11::string::string((string *)&local_190,"} is not an edge",&local_34e);
        std::operator+(&error,&local_2d8,&local_190);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
      else {
        std::__cxx11::string::string
                  ((string *)&error,"incorrect edge count",(allocator *)&local_2d8);
      }
    }
    else {
      std::__cxx11::string::string((string *)&error,"incorrect node count",(allocator *)&local_2d8);
    }
LAB_001027ec:
    Gecko::Graph::~Graph(&graph);
    std::__cxx11::string::string((string *)&local_b0,"path graph test",(allocator *)&graph);
    std::__cxx11::string::string((string *)&local_d0,(string *)&error);
    iVar5 = report(&local_b0,&local_d0,columns);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    iVar5 = iVar5 + iVar4;
    iVar4 = 2;
    for (uVar13 = 1; uVar13 <= maxdims; uVar13 = uVar13 + 1) {
      nodes = 1 << ((byte)uVar13 & 0x1f);
      local_34c = iVar4;
      local_348 = iVar5;
      Gecko::Graph::Graph(&graph,nodes);
      for (uVar10 = 1; uVar10 <= nodes; uVar10 = uVar10 + 1) {
        uVar14 = 0;
        while (uVar13 != uVar14) {
          iVar4 = Gecko::Graph::insert_arc((uint)&graph,uVar10,1.0,1.0);
          uVar14 = uVar14 + 1;
          if (iVar4 == 0) {
            std::__cxx11::string::string
                      ((string *)&error_1,"arc insertion failed",(allocator *)&local_2d8);
            goto LAB_00102906;
          }
        }
      }
      if ((int)((ulong)((long)graph.node.
                              super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)graph.node.
                             super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 4) - 1U == nodes) {
        if ((uVar13 << ((byte)uVar13 & 0x1f)) >> 1 ==
            (uint)(((ulong)((long)graph.adj.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)graph.adj.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff >> 1)
           ) {
          plVar8 = (long *)operator_new(8);
          *plVar8 = (long)&PTR__Functional_00105cf0;
          Gecko::Graph::order((Functional *)&graph,(uint)plVar8,4,6,1,(Progress *)0x1);
          (**(code **)(*plVar8 + 8))(plVar8);
          uVar16 = 0;
          do {
            if (nodes - 1 == uVar16) {
              error_1._M_dataplus._M_p = (pointer)&error_1.field_2;
              error_1._M_string_length = 0;
              error_1.field_2._M_local_buf[0] = '\0';
              goto LAB_00102906;
            }
            uVar10 = graph.perm.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar16];
            uVar14 = graph.perm.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar16 + 1];
            iVar4 = Gecko::Graph::arc_index((uint)&graph,uVar10);
            uVar16 = uVar16 + 1;
          } while (iVar4 != 0);
          std::__cxx11::string::string((string *)&local_280,"{",&local_34d);
          stringize<unsigned_int>(&error_2,uVar10);
          std::operator+(&local_260,&local_280,&error_2);
          std::__cxx11::string::string((string *)&local_150,", ",&local_34e);
          std::operator+(&local_318,&local_260,&local_150);
          stringize<unsigned_int>(&local_170,uVar14);
          std::operator+(&local_2d8,&local_318,&local_170);
          std::__cxx11::string::string((string *)&local_190,"} is not an edge",&local_339);
          std::operator+(&error_1,&local_2d8,&local_190);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
        }
        else {
          std::__cxx11::string::string
                    ((string *)&error_1,"incorrect edge count",(allocator *)&local_2d8);
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&error_1,"incorrect node count",(allocator *)&local_2d8);
      }
LAB_00102906:
      Gecko::Graph::~Graph(&graph);
      std::__cxx11::string::string((string *)&graph,"hypercube test #",(allocator *)&local_318);
      stringize<unsigned_int>(&local_2d8,uVar13);
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&graph,
                     &local_2d8);
      std::__cxx11::string::string((string *)&local_50,(string *)&error_1);
      iVar5 = report(&local_f0,&local_50,columns_00);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      iVar5 = local_348 + iVar5;
      iVar4 = local_34c + 1;
    }
    local_320 = 0;
    local_32c = 2;
    uVar16 = 1;
    while( true ) {
      uVar13 = (uint)uVar16;
      if (maxsize < uVar13) break;
      local_2d8._M_dataplus._M_p = (pointer)0x0;
      local_2d8._M_string_length = 0x3ff0000000000000;
      local_2d8.field_2._M_allocated_capacity = 0x4008000000000000;
      local_2d8.field_2._8_8_ = 0x406c200000000000;
      uStack_2b8 = 0x4125061200000000;
      local_2b0 = 0x4240fc49c2668000;
      uStack_2a8 = 0x43ab53e135c9de4c;
      local_338 = uVar16;
      if (uVar13 < 8) {
        uVar10 = uVar13 - 1;
        fVar3 = (float)(uVar13 * uVar10 * 2);
        if (fVar3 == 0.0) {
          local_344 = 0.0;
        }
        else {
          dVar2 = log((double)(&local_2d8._M_dataplus)[uVar16]._M_p);
          dVar2 = exp(dVar2 / (double)(uint)fVar3);
          local_344 = (float)dVar2;
        }
        local_340 = fVar3;
        Gecko::Graph::Graph(&graph,0);
        uVar14 = (int)local_338 * (int)local_338;
        uVar13 = 0;
        local_34c = iVar4;
        local_348 = iVar5;
        while (iVar5 = local_348, iVar4 = local_34c, uVar1 = uVar13 + 1, uVar1 <= uVar14) {
          Gecko::Graph::insert_node(1.0);
          uVar15 = uVar13 / (uint)local_338;
          uVar9 = uVar13 % (uint)local_338;
          if (uVar9 != 0) {
            Gecko::Graph::insert_arc((uint)&graph,uVar1,1.0,1.0);
          }
          if (uVar9 < uVar10) {
            Gecko::Graph::insert_arc((uint)&graph,uVar1,1.0,1.0);
          }
          if ((uint)local_338 <= uVar13) {
            Gecko::Graph::insert_arc((uint)&graph,uVar1,1.0,1.0);
          }
          uVar13 = uVar1;
          if (uVar15 < uVar10) {
            Gecko::Graph::insert_arc((uint)&graph,uVar1,1.0,1.0);
          }
        }
        if ((int)((ulong)((long)graph.node.
                                super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)graph.node.
                               super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 4) - 1U == uVar14) {
          if (local_340 ==
              (float)(((ulong)((long)graph.adj.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)graph.adj.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff >>
                     1)) {
            plVar8 = (long *)operator_new(8);
            *plVar8 = (long)&PTR__Functional_00105cf0;
            Gecko::Graph::order((Functional *)&graph,(uint)plVar8,9,5,2,(Progress *)0x1);
            local_340 = (float)Gecko::Graph::cost();
            (**(code **)(*plVar8 + 8))(plVar8);
            if (local_340 <= local_344 * 1.01) {
              error_2._M_dataplus._M_p = (pointer)&error_2.field_2;
              error_2._M_string_length = 0;
              error_2.field_2._M_local_buf[0] = '\0';
            }
            else {
              stringize<float>(&local_260,local_340);
              std::operator+(&local_318,&local_260," > ");
              stringize<float>(&local_280,local_344);
              std::operator+(&error_2,&local_318,&local_280);
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
              std::__cxx11::string::_M_dispose();
            }
          }
          else {
            std::__cxx11::string::string
                      ((string *)&error_2,"incorrect edge count",(allocator *)&local_318);
          }
        }
        else {
          std::__cxx11::string::string
                    ((string *)&error_2,"incorrect node count",(allocator *)&local_318);
          iVar5 = local_348;
          iVar4 = local_34c;
        }
        Gecko::Graph::~Graph(&graph);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&error_2,"grid size exceeds maximum size",(allocator *)&graph);
      }
      std::__cxx11::string::string((string *)&graph,"grid test #",(allocator *)&local_318);
      stringize<unsigned_int>(&local_2d8,(uint)local_338);
      std::operator+(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&graph,
                     &local_2d8);
      std::__cxx11::string::string((string *)&local_70,(string *)&error_2);
      iVar6 = report(&local_110,&local_70,columns_01);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      iVar5 = iVar5 + iVar6;
      iVar4 = iVar4 + 1;
      uVar16 = (ulong)((int)local_338 + 1);
      local_32c = local_32c + 1;
      local_320 = (ulong)((int)local_320 - 1);
    }
    poVar7 = (ostream *)&std::cerr;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    if (iVar5 == 0) {
      pcVar11 = "all tests passed";
    }
    else {
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      poVar7 = std::operator<<(poVar7," test");
      pcVar11 = "s";
      if (iVar5 == 1) {
        pcVar11 = "";
      }
      poVar7 = std::operator<<(poVar7,pcVar11);
      poVar7 = std::operator<<(poVar7," of ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      pcVar11 = " failed";
    }
    poVar7 = std::operator<<(poVar7,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar7);
    uVar13 = (uint)(iVar5 != 0);
    std::__cxx11::string::_M_dispose();
  }
  else {
    uVar13 = 1;
    poVar7 = std::operator<<((ostream *)&std::cerr,"Usage: testgecko [maxdims [maxsize]]");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  return uVar13;
code_r0x0010253d:
  Gecko::Graph::insert_arc(uVar14,uVar10,1.0,1.0);
  uVar13 = 0x10001;
  if (uVar10 != 0x10000) {
LAB_00102567:
    Gecko::Graph::insert_arc(uVar14,uVar10,1.0,1.0);
    uVar13 = uVar10 + 1;
  }
  goto LAB_0010252b;
}

Assistant:

int main(int argc, char* argv[])
{
  uint tests = 0;    // number of tests performed
  uint failures = 0; // number of failed tests
  uint maxdims = 5;  // number of hypercube dimensions
  uint maxsize = 6;  // max grid dimensions

  switch (argc) {
    case 3:
      if (sscanf(argv[2], "%u", &maxsize) != 1)
        goto usage;
      // FALLTHROUGH
    case 2:
      if (sscanf(argv[1], "%u", &maxdims) != 1)
        goto usage;
      // FALLTHROUGH
    case 1:
      break;
    default:
    usage:
      std::cerr << "Usage: testgecko [maxdims [maxsize]]" << std::endl;
      return EXIT_FAILURE;
  }

  // print version info and ensure header matches binary
  failures += report("library version test", init() ? std::string() : std::string("header and binary version mismatch"));
  tests++;

  // order path
  std::string error = path_test();
  failures += report("path graph test", error);
  tests++;

  // order hypercubes
  for (uint dims = 1; dims <= maxdims; dims++) {
    std::string error = hypercube_test(dims);
    failures += report(std::string("hypercube test #") + stringize(dims), error);
    tests++;
  }

  // order grids
  for (uint size = 1; size <= maxsize; size++) {
    std::string error = grid_test(size);
    failures += report(std::string("grid test #") + stringize(size), error);
    tests++;
  }

  // summarize tests
  return finish(failures, tests);
}